

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

Page * __thiscall QToolBoxPrivate::page(QToolBoxPrivate *this,int index)

{
  reference pvVar1;
  
  if ((-1 < index) &&
     (index < (int)((ulong)((long)(this->pageList).
                                  super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->pageList).
                                 super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
    pvVar1 = std::
             vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ::operator[](&this->pageList,(ulong)(uint)index);
    return (pvVar1->_M_t).
           super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
           ._M_t.
           super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
           .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
  }
  return (Page *)0x0;
}

Assistant:

QToolBoxPrivate::Page *QToolBoxPrivate::page(int index)
{
    if (index >= 0 && index < static_cast<int>(pageList.size()))
        return pageList[index].get();
    return nullptr;
}